

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

int QString::toIntegral_helper<int>(QStringView string,bool *ok,int base)

{
  long lVar1;
  QStringView QVar2;
  int in_ECX;
  bool *in_RDX;
  storage_type_conflict *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  Int64 val;
  undefined8 local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2.m_data = in_RSI;
  QVar2.m_size = in_RDI;
  local_40 = ::QString::toIntegral_helper(QVar2,in_RDX,in_ECX);
  if ((int)local_40 != local_40) {
    if (in_RDX != (bool *)0x0) {
      *in_RDX = false;
    }
    local_40 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)local_40;
  }
  __stack_chk_fail();
}

Assistant:

static
    T toIntegral_helper(QStringView string, bool *ok, int base)
    {
        using Int64 = typename std::conditional<std::is_unsigned<T>::value, qulonglong, qlonglong>::type;
        using Int32 = typename std::conditional<std::is_unsigned<T>::value, uint, int>::type;

        // we select the right overload by casting base to int or uint
        Int64 val = toIntegral_helper(string, ok, Int32(base));
        if (T(val) != val) {
            if (ok)
                *ok = false;
            val = 0;
        }
        return T(val);
    }